

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O2

void __thiscall agg::trans_single_path::finalize_path(trans_single_path *this)

{
  double dVar1;
  vertex_dist **ppvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  vertex_dist *pvVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  
  if ((this->m_status == making_path) &&
     (1 < (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size)) {
    uVar7 = 0;
    vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,0);
    uVar5 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
    if (2 < uVar5) {
      ppvVar2 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      uVar8 = uVar5 - 2 & 0x3f;
      dVar9 = ppvVar2[uVar5 - 2 >> 6][uVar8].dist;
      dVar1 = ppvVar2[uVar5 - 3 >> 6][uVar5 - 3 & 0x3f].dist;
      if (dVar9 * 10.0 < dVar1) {
        pvVar6 = ppvVar2[uVar5 - 2 >> 6] + uVar8;
        pvVar3 = ppvVar2[uVar5 - 1 >> 6];
        uVar5 = uVar5 - 1 & 0x3f;
        pvVar6->dist = pvVar3[uVar5].dist;
        pvVar3 = pvVar3 + uVar5;
        dVar4 = pvVar3->y;
        pvVar6->x = pvVar3->x;
        pvVar6->y = dVar4;
        uVar5 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = uVar5 - 1;
          (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size = uVar5;
        }
        (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks[uVar5 - 2 >> 6]
        [uVar5 - 2 & 0x3f].dist = dVar9 + dVar1;
      }
    }
    ppvVar2 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
    dVar9 = 0.0;
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      pvVar3 = ppvVar2[uVar7 >> 6];
      dVar1 = pvVar3[uVar7 & 0x3f].dist;
      pvVar3[uVar7 & 0x3f].dist = dVar9;
      dVar9 = dVar1 + dVar9;
    }
    this->m_kindex = (double)(uVar5 - 1) / dVar9;
    this->m_status = ready;
  }
  return;
}

Assistant:

void trans_single_path::finalize_path()
    {
        if(m_status == making_path && m_src_vertices.size() > 1)
        {
            unsigned i;
            double dist;
            double d;

            m_src_vertices.close(false);
            if(m_src_vertices.size() > 2)
            {
                if(m_src_vertices[m_src_vertices.size() - 2].dist * 10.0 < 
                   m_src_vertices[m_src_vertices.size() - 3].dist)
                {
                    d = m_src_vertices[m_src_vertices.size() - 3].dist + 
                        m_src_vertices[m_src_vertices.size() - 2].dist;

                    m_src_vertices[m_src_vertices.size() - 2] = 
                        m_src_vertices[m_src_vertices.size() - 1];

                    m_src_vertices.remove_last();
                    m_src_vertices[m_src_vertices.size() - 2].dist = d;
                }
            }

            dist = 0.0;
            for(i = 0; i < m_src_vertices.size(); i++)
            {
                vertex_dist& v = m_src_vertices[i];
                double d = v.dist;
                v.dist = dist;
                dist += d;
            }
            m_kindex = (m_src_vertices.size() - 1) / dist;
            m_status = ready;
        }
    }